

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDepends.cxx
# Opt level: O0

bool __thiscall
cmDepends::CheckDependencies
          (cmDepends *this,istream *internalDepends,string *internalDependsFileName,
          DependencyMap *validDeps)

{
  bool bVar1;
  istream *piVar2;
  ulong uVar3;
  char *pcVar4;
  cmAlphaNum local_270;
  cmAlphaNum local_240;
  string local_210;
  cmAlphaNum local_1f0;
  cmAlphaNum local_1c0;
  string local_190;
  cmAlphaNum local_170;
  cmAlphaNum local_140;
  string local_110;
  undefined1 local_ea;
  byte local_e9;
  string local_e8 [6];
  bool dependeeExists;
  bool regenerate;
  mapped_type *local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *currentDependencies;
  cmFileTime dependeeTime;
  cmFileTime dependerTime;
  string dependee;
  string depender;
  string local_60 [8];
  string line;
  bool dependerExists;
  bool okay;
  cmFileTime internalDependsTime;
  DependencyMap *validDeps_local;
  string *internalDependsFileName_local;
  istream *internalDepends_local;
  cmDepends *this_local;
  
  internalDependsTime.Time = (TimeType)validDeps;
  cmFileTime::cmFileTime((cmFileTime *)&stack0xffffffffffffffc8);
  bVar1 = cmFileTimeCache::Load
                    (this->FileTimeCache,internalDependsFileName,
                     (cmFileTime *)&stack0xffffffffffffffc8);
  if (bVar1) {
    line.field_2._M_local_buf[0xf] = '\x01';
    line.field_2._M_local_buf[0xe] = '\0';
    std::__cxx11::string::string(local_60);
    std::__cxx11::string::reserve((ulong)local_60);
    std::__cxx11::string::string((string *)(dependee.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)&dependerTime);
    cmFileTime::cmFileTime(&dependeeTime);
    cmFileTime::cmFileTime((cmFileTime *)&currentDependencies);
    local_c8 = (mapped_type *)0x0;
LAB_0088911a:
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       (internalDepends,local_60);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    if (bVar1) {
      uVar3 = std::__cxx11::string::empty();
      if (((uVar3 & 1) == 0) && (pcVar4 = (char *)std::__cxx11::string::front(), *pcVar4 != '#')) {
        pcVar4 = (char *)std::__cxx11::string::back();
        if (*pcVar4 == '\r') {
          std::__cxx11::string::pop_back();
          uVar3 = std::__cxx11::string::empty();
          if ((uVar3 & 1) != 0) goto LAB_0088911a;
        }
        pcVar4 = (char *)std::__cxx11::string::front();
        if (*pcVar4 == ' ') {
          std::__cxx11::string::substr((ulong)local_e8,(ulong)local_60);
          std::__cxx11::string::operator=((string *)&dependerTime,local_e8);
          std::__cxx11::string::~string(local_e8);
          if (local_c8 !=
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(local_c8,(value_type *)&dependerTime);
          }
          local_e9 = 0;
          local_ea = cmFileTimeCache::Load
                               (this->FileTimeCache,(string *)&dependerTime,
                                (cmFileTime *)&currentDependencies);
          if ((bool)local_ea) {
            if ((line.field_2._M_local_buf[0xe] & 1U) == 0) {
              bVar1 = cmFileTime::Older((cmFileTime *)&stack0xffffffffffffffc8,
                                        (cmFileTime *)&currentDependencies);
              if ((bVar1) && (local_e9 = 1, (this->Verbose & 1U) != 0)) {
                cmAlphaNum::cmAlphaNum(&local_240,"Dependee \"");
                cmAlphaNum::cmAlphaNum(&local_270,(string *)&dependerTime);
                cmStrCat<char[31],std::__cxx11::string,char[4]>
                          (&local_210,&local_240,&local_270,
                           (char (*) [31])"\" is newer than depends file \"",internalDependsFileName
                           ,(char (*) [4])0xc7bbf7);
                cmSystemTools::Stdout(&local_210);
                std::__cxx11::string::~string((string *)&local_210);
              }
            }
            else {
              bVar1 = cmFileTime::Older(&dependeeTime,(cmFileTime *)&currentDependencies);
              if ((bVar1) && (local_e9 = 1, (this->Verbose & 1U) != 0)) {
                cmAlphaNum::cmAlphaNum(&local_1c0,"Dependee \"");
                cmAlphaNum::cmAlphaNum(&local_1f0,(string *)&dependerTime);
                cmStrCat<char[27],std::__cxx11::string,char[4]>
                          (&local_190,&local_1c0,&local_1f0,
                           (char (*) [27])"\" is newer than depender \"",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&dependee.field_2 + 8),(char (*) [4])0xc7bbf7);
                cmSystemTools::Stdout(&local_190);
                std::__cxx11::string::~string((string *)&local_190);
              }
            }
          }
          else {
            local_e9 = 1;
            if ((this->Verbose & 1U) != 0) {
              cmAlphaNum::cmAlphaNum(&local_140,"Dependee \"");
              cmAlphaNum::cmAlphaNum(&local_170,(string *)&dependerTime);
              cmStrCat<char[32],std::__cxx11::string,char[4]>
                        (&local_110,&local_140,&local_170,
                         (char (*) [32])"\" does not exist for depender \"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&dependee.field_2 + 8),(char (*) [4])0xc7bbf7);
              cmSystemTools::Stdout(&local_110);
              std::__cxx11::string::~string((string *)&local_110);
            }
          }
          if ((local_e9 & 1) != 0) {
            line.field_2._M_local_buf[0xf] = '\0';
            if (local_c8 != (mapped_type *)0x0) {
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
              ::erase((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                       *)internalDependsTime.Time,(key_type *)((long)&dependee.field_2 + 8));
              local_c8 = (mapped_type *)0x0;
            }
            if ((line.field_2._M_local_buf[0xe] & 1U) != 0) {
              cmsys::SystemTools::RemoveFile((string *)((long)&dependee.field_2 + 8));
              cmFileTimeCache::Remove(this->FileTimeCache,(string *)((long)&dependee.field_2 + 8));
              line.field_2._M_local_buf[0xe] = '\0';
            }
          }
        }
        else {
          std::__cxx11::string::operator=((string *)(dependee.field_2._M_local_buf + 8),local_60);
          line.field_2._M_local_buf[0xe] =
               cmFileTimeCache::Load
                         (this->FileTimeCache,(string *)((long)&dependee.field_2 + 8),&dependeeTime)
          ;
          local_c8 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                   *)internalDependsTime.Time,
                                  (key_type *)((long)&dependee.field_2 + 8));
        }
      }
      goto LAB_0088911a;
    }
    this_local._7_1_ = (bool)(line.field_2._M_local_buf[0xf] & 1);
    std::__cxx11::string::~string((string *)&dependerTime);
    std::__cxx11::string::~string((string *)(dependee.field_2._M_local_buf + 8));
    std::__cxx11::string::~string(local_60);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmDepends::CheckDependencies(std::istream& internalDepends,
                                  const std::string& internalDependsFileName,
                                  DependencyMap& validDeps)
{
  // Read internal depends file time
  cmFileTime internalDependsTime;
  if (!this->FileTimeCache->Load(internalDependsFileName,
                                 internalDependsTime)) {
    return false;
  }

  // Parse dependencies from the stream.  If any dependee is missing
  // or newer than the depender then dependencies should be
  // regenerated.
  bool okay = true;
  bool dependerExists = false;

  std::string line;
  line.reserve(1024);
  std::string depender;
  std::string dependee;
  cmFileTime dependerTime;
  cmFileTime dependeeTime;
  std::vector<std::string>* currentDependencies = nullptr;

  while (std::getline(internalDepends, line)) {
    // Check if this an empty or a comment line
    if (line.empty() || line.front() == '#') {
      continue;
    }
    // Drop carriage return character at the end
    if (line.back() == '\r') {
      line.pop_back();
      if (line.empty()) {
        continue;
      }
    }
    // Check if this a depender line
    if (line.front() != ' ') {
      depender = line;
      dependerExists = this->FileTimeCache->Load(depender, dependerTime);
      // If we erase validDeps[this->Depender] by overwriting it with an empty
      // vector, we lose dependencies for dependers that have multiple
      // entries. No need to initialize the entry, std::map will do so on first
      // access.
      currentDependencies = &validDeps[depender];
      continue;
    }

    // This is a dependee line
    dependee = line.substr(1);

    // Add dependee to depender's list
    if (currentDependencies != nullptr) {
      currentDependencies->push_back(dependee);
    }

    // Dependencies must be regenerated
    // * if the dependee does not exist
    // * if the depender exists and is older than the dependee.
    // * if the depender does not exist, but the dependee is newer than the
    //   depends file
    bool regenerate = false;
    bool dependeeExists = this->FileTimeCache->Load(dependee, dependeeTime);
    if (!dependeeExists) {
      // The dependee does not exist.
      regenerate = true;

      // Print verbose output.
      if (this->Verbose) {
        cmSystemTools::Stdout(cmStrCat("Dependee \"", dependee,
                                       "\" does not exist for depender \"",
                                       depender, "\".\n"));
      }
    } else if (dependerExists) {
      // The dependee and depender both exist.  Compare file times.
      if (dependerTime.Older(dependeeTime)) {
        // The depender is older than the dependee.
        regenerate = true;

        // Print verbose output.
        if (this->Verbose) {
          cmSystemTools::Stdout(cmStrCat("Dependee \"", dependee,
                                         "\" is newer than depender \"",
                                         depender, "\".\n"));
        }
      }
    } else {
      // The dependee exists, but the depender doesn't. Regenerate if the
      // internalDepends file is older than the dependee.
      if (internalDependsTime.Older(dependeeTime)) {
        // The depends-file is older than the dependee.
        regenerate = true;

        // Print verbose output.
        if (this->Verbose) {
          cmSystemTools::Stdout(cmStrCat("Dependee \"", dependee,
                                         "\" is newer than depends file \"",
                                         internalDependsFileName, "\".\n"));
        }
      }
    }

    if (regenerate) {
      // Dependencies must be regenerated.
      okay = false;

      // Remove the information of this depender from the map, it needs
      // to be rescanned
      if (currentDependencies != nullptr) {
        validDeps.erase(depender);
        currentDependencies = nullptr;
      }

      // Remove the depender to be sure it is rebuilt.
      if (dependerExists) {
        cmSystemTools::RemoveFile(depender);
        this->FileTimeCache->Remove(depender);
        dependerExists = false;
      }
    }
  }

  return okay;
}